

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateFieldAccessorDeclarations
          (MessageGenerator *this,Printer *printer)

{
  long lVar1;
  FieldDescriptor *field_00;
  bool bVar2;
  bool bVar3;
  Type TVar4;
  mapped_type *this_00;
  FieldGenerator *pFVar5;
  Descriptor *pDVar6;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  FieldDescriptor *field_03;
  char *text;
  long lVar7;
  long lVar8;
  ulong uVar9;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ordered_fields;
  FieldDescriptor *field;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_c8;
  key_type local_b0;
  string local_90;
  undefined1 local_70 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Base_ptr local_50;
  size_t local_48;
  FieldGeneratorMap *local_40;
  Options *local_38;
  
  local_c8.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (FieldDescriptor **)0x0;
  local_c8.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (FieldDescriptor **)0x0;
  local_c8.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (FieldDescriptor **)0x0;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::reserve(&local_c8,(long)*(int *)(this->descriptor_ + 0x2c));
  std::
  vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
  ::
  _M_range_insert<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>>
            ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
              *)&local_c8,
             local_c8.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->optimized_order_).
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->optimized_order_).
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  pDVar6 = this->descriptor_;
  if (0 < *(int *)(pDVar6 + 0x2c)) {
    lVar8 = 0;
    lVar7 = 0;
    do {
      lVar1 = *(long *)(pDVar6 + 0x30);
      local_70._0_8_ = lVar1 + lVar8;
      if ((*(long *)(lVar1 + 0x60 + lVar8) != 0) ||
         (*(char *)(*(long *)(lVar1 + 0x80 + lVar8) + 0x6f) != '\0')) {
        if (local_c8.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_c8.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
          ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                    ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                      *)&local_c8,
                     (iterator)
                     local_c8.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(FieldDescriptor **)local_70);
        }
        else {
          *local_c8.
           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_finish = (FieldDescriptor *)local_70._0_8_;
          local_c8.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_c8.
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      lVar7 = lVar7 + 1;
      pDVar6 = this->descriptor_;
      lVar8 = lVar8 + 0xa8;
    } while (lVar7 < *(int *)(pDVar6 + 0x2c));
  }
  if (local_c8.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_c8.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_38 = &this->options_;
    local_40 = &this->field_generators_;
    uVar9 = 0;
    do {
      field_00 = local_c8.
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar9];
      anon_unknown_0::PrintFieldComment<google::protobuf::FieldDescriptor>(printer,field_00);
      local_70._8_4_ = _S_red;
      local_60._M_allocated_capacity = 0;
      local_60._8_8_ = local_70 + 8;
      local_48 = 0;
      local_50 = (_Base_ptr)local_60._8_8_;
      SetCommonFieldVariables
                (field_00,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_70,local_38);
      FieldConstantName_abi_cxx11_(&local_90,(cpp *)field_00,field_01);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"constant_name","");
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_70,&local_b0);
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (this->use_dependent_base_ == true) {
        bVar2 = IsFieldDependent(field_00);
      }
      else {
        bVar2 = false;
      }
      if (bVar2 != false) {
        TVar4 = FieldDescriptor::type(field_00);
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar4 * 4) == 10) {
          bVar3 = FieldDescriptor::is_map(field_00);
          if (!bVar3) {
            FieldMessageTypeName_abi_cxx11_(&local_90,(cpp *)field_00,field_02);
            DependentTypeName_abi_cxx11_(&local_b0,(cpp *)field_00,field_03);
            io::Printer::Print(printer,"private:\ntypedef $field_type$ $dependent_type$;\npublic:\n"
                               ,"field_type",&local_90,"dependent_type",&local_b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            }
          }
        }
      }
      text = "$deprecated_attr$int $name$_size() const;\n";
      if ((*(int *)(field_00 + 0x4c) == 3) ||
         (text = "$deprecated_attr$bool has_$name$() const;\n",
         *(int *)(*(long *)(field_00 + 0x30) + 0x8c) != 3)) {
LAB_0025297e:
        io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)local_70,text);
      }
      else {
        TVar4 = FieldDescriptor::type(field_00);
        text = "$deprecated_attr$bool has_$name$() const;\n";
        if ((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar4 * 4) == 10) ||
           ((*(int *)(*(long *)(field_00 + 0x30) + 0x8c) == 3 &&
            (text = "private:\nbool has_$name$() const;\npublic:\n", *(long *)(field_00 + 0x60) != 0
            )))) goto LAB_0025297e;
      }
      if (bVar2 == false) {
        io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)local_70,"$deprecated_attr$void clear_$name$();\n");
      }
      io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)local_70,
                         "$deprecated_attr$static const int $constant_name$ = $number$;\n");
      pFVar5 = FieldGeneratorMap::get(local_40,field_00);
      (*pFVar5->_vptr_FieldGenerator[5])(pFVar5,printer);
      io::Printer::Print(printer,"\n");
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_70);
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)((long)local_c8.
                                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_c8.
                                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (0 < *(int *)(this->descriptor_ + 0x68)) {
    io::Printer::Print(printer,"GOOGLE_PROTOBUF_EXTENSION_ACCESSORS($classname$)\n","classname",
                       &this->classname_);
  }
  pDVar6 = this->descriptor_;
  if (0 < *(int *)(pDVar6 + 0x38)) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      UnderscoresToCamelCase((string *)local_70,*(string **)(*(long *)(pDVar6 + 0x40) + lVar7),true)
      ;
      io::Printer::Print(printer,"$camel_oneof_name$Case $oneof_name$_case() const;\n",
                         "camel_oneof_name",(string *)local_70,"oneof_name",
                         *(string **)(*(long *)(this->descriptor_ + 0x40) + lVar7));
      if ((FieldDescriptor *)local_70._0_8_ != (FieldDescriptor *)(local_70 + 0x10)) {
        operator_delete((void *)local_70._0_8_,(ulong)(local_60._M_allocated_capacity + 1));
      }
      lVar8 = lVar8 + 1;
      pDVar6 = this->descriptor_;
      lVar7 = lVar7 + 0x30;
    } while (lVar8 < *(int *)(pDVar6 + 0x38));
  }
  if (local_c8.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (FieldDescriptor **)0x0) {
    operator_delete(local_c8.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateFieldAccessorDeclarations(io::Printer* printer) {
  // optimized_fields_ does not contain fields where
  //    field->containing_oneof() != NULL
  // so we need to iterate over those as well.
  //
  // We place the non-oneof fields in optimized_order_, as that controls the
  // order of the _has_bits_ entries and we want GDB's pretty printers to be
  // able to infer these indices from the k[FIELDNAME]FieldNumber order.
  std::vector<const FieldDescriptor*> ordered_fields;
  ordered_fields.reserve(descriptor_->field_count());

  ordered_fields.insert(
      ordered_fields.begin(), optimized_order_.begin(), optimized_order_.end());
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->containing_oneof() == NULL && !field->options().weak()) {
      continue;
    }
    ordered_fields.push_back(field);
  }

  for (int i = 0; i < ordered_fields.size(); i++) {
    const FieldDescriptor* field = ordered_fields[i];

    PrintFieldComment(printer, field);

    std::map<string, string> vars;
    SetCommonFieldVariables(field, &vars, options_);
    vars["constant_name"] = FieldConstantName(field);

    bool dependent_field = use_dependent_base_ && IsFieldDependent(field);
    if (dependent_field &&
        field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
        !field->is_map()) {
      // If this field is dependent, the dependent base class determines
      // the message type from the derived class (which is a template
      // parameter). This typedef is for that:
      printer->Print(
          "private:\n"
          "typedef $field_type$ $dependent_type$;\n"
          "public:\n",
          "field_type", FieldMessageTypeName(field),
          "dependent_type", DependentTypeName(field));
    }

    if (field->is_repeated()) {
      printer->Print(vars, "$deprecated_attr$int $name$_size() const;\n");
    } else if (HasHasMethod(field)) {
      printer->Print(vars, "$deprecated_attr$bool has_$name$() const;\n");
    } else if (HasPrivateHasMethod(field)) {
      printer->Print(vars,
          "private:\n"
          "bool has_$name$() const;\n"
          "public:\n");
    }

    if (!dependent_field) {
      // If this field is dependent, then its clear_() method is in the
      // depenent base class. (See also GenerateDependentAccessorDeclarations.)
      printer->Print(vars, "$deprecated_attr$void clear_$name$();\n");
    }
    printer->Print(vars,
                   "$deprecated_attr$static const int $constant_name$ = "
                   "$number$;\n");

    // Generate type-specific accessor declarations.
    field_generators_.get(field).GenerateAccessorDeclarations(printer);

    printer->Print("\n");
  }

  if (descriptor_->extension_range_count() > 0) {
    // Generate accessors for extensions.  We just call a macro located in
    // extension_set.h since the accessors about 80 lines of static code.
    printer->Print(
      "GOOGLE_PROTOBUF_EXTENSION_ACCESSORS($classname$)\n",
      "classname", classname_);
  }

  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    printer->Print(
        "$camel_oneof_name$Case $oneof_name$_case() const;\n",
        "camel_oneof_name",
        UnderscoresToCamelCase(descriptor_->oneof_decl(i)->name(), true),
        "oneof_name", descriptor_->oneof_decl(i)->name());
  }
}